

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

void __thiscall embree::Variant::Variant(Variant *this,shared_ptr<embree::Texture> *tex)

{
  shared_ptr<embree::Texture> *in_RSI;
  shared_ptr<embree::Texture> *in_RDI;
  
  *(undefined4 *)&(in_RDI->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       0xe;
  std::shared_ptr<embree::Texture>::shared_ptr(in_RSI,in_RDI);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[4].super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

Variant (const std::shared_ptr<Texture> tex) : type(TEXTURE), texture(tex) {}